

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadsavemenu.cpp
# Opt level: O0

void __thiscall DSaveMenu::Destroy(DSaveMenu *this)

{
  FSaveGameNode **ppFVar1;
  DSaveMenu *this_local;
  
  ppFVar1 = TArray<FSaveGameNode_*,_FSaveGameNode_*>::operator[](&DLoadSaveMenu::SaveGames,0);
  if (*ppFVar1 == &this->NewSaveNode) {
    TArray<FSaveGameNode_*,_FSaveGameNode_*>::Delete(&DLoadSaveMenu::SaveGames,0);
    if ((this->super_DLoadSaveMenu).Selected == 0) {
      (this->super_DLoadSaveMenu).Selected = -1;
    }
    else {
      (this->super_DLoadSaveMenu).Selected = (this->super_DLoadSaveMenu).Selected + -1;
    }
  }
  DLoadSaveMenu::Destroy(&this->super_DLoadSaveMenu);
  return;
}

Assistant:

void DSaveMenu::Destroy()
{
	if (SaveGames[0] == &NewSaveNode)
	{
		SaveGames.Delete(0);
		if (Selected == 0) Selected = -1;
		else Selected--;
	}
	Super::Destroy();
}